

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioCreate(FAudio **ppFAudio,uint32_t Flags,FAudioProcessor XAudio2Processor)

{
  FAudioProcessor XAudio2Processor_00;
  
  FAudioCOMConstructEXT(ppFAudio,'\b');
  FAudio_Initialize(*ppFAudio,Flags,XAudio2Processor_00);
  return 0;
}

Assistant:

uint32_t FAudioCreate(
	FAudio **ppFAudio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor
) {
	FAudioCOMConstructEXT(ppFAudio, FAUDIO_TARGET_VERSION);
	FAudio_Initialize(*ppFAudio, Flags, XAudio2Processor);
	return 0;
}